

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<short,_signed_char>(short input)

{
  bool bVar1;
  string *in_RDI;
  int16_t in_stack_fffffffffffffdfe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string local_1e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [15];
  PhysicalType in_stack_fffffffffffffeef;
  string local_100 [32];
  string local_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  bVar1 = TypeIsNumber<short>();
  if ((bVar1) && (bVar1 = TypeIsNumber<signed_char>(), bVar1)) {
    GetTypeId<short>();
    pbVar2 = &local_b0;
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)pbVar2,in_stack_fffffffffffffe00);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar2,(char *)in_stack_fffffffffffffe00);
    ConvertToString::Operation<short>(in_stack_fffffffffffffdfe);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar2,(char *)in_stack_fffffffffffffe00);
    GetTypeId<signed_char>();
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::__cxx11::string::~string(local_100);
    ::std::__cxx11::string::~string(local_30);
    ::std::__cxx11::string::~string(local_50);
    ::std::__cxx11::string::~string(local_e0);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::~string(local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    GetTypeId<short>();
    pbVar2 = &local_1a0;
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)in_stack_fffffffffffffe08,pbVar2);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe08,(char *)pbVar2);
    ConvertToString::Operation<short>(in_stack_fffffffffffffdfe);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe08,(char *)pbVar2);
    GetTypeId<signed_char>();
    TypeIdToString(in_stack_fffffffffffffeef);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::__cxx11::string::~string(local_1e0);
    ::std::__cxx11::string::~string(local_120);
    ::std::__cxx11::string::~string(local_140);
    ::std::__cxx11::string::~string(local_1c0);
    ::std::__cxx11::string::~string(local_160);
    ::std::__cxx11::string::~string(local_180);
    ::std::__cxx11::string::~string((string *)&local_1a0);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}